

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

Connection * __thiscall duckdb::Connection::operator=(Connection *this,Connection *other)

{
  warning_callback_t p_Var1;
  connection_t cVar2;
  
  ::std::swap<duckdb::shared_ptr<duckdb::ClientContext,true>>(&this->context,&other->context);
  p_Var1 = this->warning_cb;
  this->warning_cb = other->warning_cb;
  other->warning_cb = p_Var1;
  cVar2 = this->connection_id;
  this->connection_id = other->connection_id;
  other->connection_id = cVar2;
  return this;
}

Assistant:

Connection &Connection::operator=(Connection &&other) noexcept {
	std::swap(context, other.context);
	std::swap(warning_cb, other.warning_cb);
	std::swap(connection_id, other.connection_id);
	return *this;
}